

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O1

QcSocket * qc_tcp_accept(QcSocket *socket)

{
  int iVar1;
  QcSocket *__ptr;
  uint extraout_EDX;
  int extraout_EDX_00;
  char *in_RSI;
  QcSocket *pQVar2;
  int addr_len;
  sockaddr addr;
  sockaddr sStack_58;
  socklen_t local_24;
  sockaddr local_20;
  
  if (socket == (QcSocket *)0x0) {
    qc_tcp_accept_cold_2();
    pQVar2 = socket;
  }
  else {
    pQVar2 = (QcSocket *)0x4;
    __ptr = (QcSocket *)malloc(4);
    if (__ptr != (QcSocket *)0x0) {
      __ptr->sockfd = 0;
      local_24 = 0x10;
      iVar1 = accept(socket->sockfd,&local_20,&local_24);
      __ptr->sockfd = iVar1;
      if (iVar1 < 0) {
        _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xb2,"socket accept failed");
        free(__ptr);
        __ptr = (QcSocket *)0x0;
      }
      return __ptr;
    }
  }
  qc_tcp_accept_cold_1();
  if (pQVar2 == (QcSocket *)0x0) {
    qc_tcp_connect_cold_3();
  }
  else if (in_RSI != (char *)0x0) {
    if (0 < (int)extraout_EDX) {
      sStack_58.sa_family = 2;
      sStack_58.sa_data._0_2_ = (ushort)extraout_EDX << 8 | (ushort)extraout_EDX >> 8;
      sStack_58.sa_data._2_4_ = inet_addr(in_RSI);
      iVar1 = connect(pQVar2->sockfd,&sStack_58,0x10);
      if (iVar1 == 0) {
        pQVar2 = (QcSocket *)0x0;
      }
      else {
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0xc9,"tcp connect failed (ip=%s, port=%d)",in_RSI,(ulong)extraout_EDX);
        pQVar2 = (QcSocket *)0xffffffff;
      }
      return pQVar2;
    }
    goto LAB_00107468;
  }
  qc_tcp_connect_cold_2();
LAB_00107468:
  qc_tcp_connect_cold_1();
  pQVar2 = (QcSocket *)send(pQVar2->sockfd,in_RSI,(long)extraout_EDX_00,0x4000);
  return pQVar2;
}

Assistant:

QcSocket* qc_tcp_accept(QcSocket *socket)
{
    QcSocket *new_sock;
    struct sockaddr addr;
    int addr_len;

    qc_assert(socket);

    qc_malloc(new_sock, sizeof(QcSocket));

    addr_len = sizeof(addr);

    new_sock->sockfd = (int)accept(socket->sockfd, &addr, (socklen_t*)&addr_len);
    if(new_sock->sockfd < 0)
    {
        qc_error("socket accept failed");
        qc_free(new_sock);
        return NULL;
    }

    return new_sock;
}